

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtaudio_c.cpp
# Opt level: O3

rtaudio_api_t rtaudio_compiled_api_by_name(char *name)

{
  Api AVar1;
  size_t sVar2;
  string local_38;
  
  if (name == (char *)0x0) {
    AVar1 = UNSPECIFIED;
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    sVar2 = strlen(name);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,name,name + sVar2);
    AVar1 = RtAudio::getCompiledApiByName(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return AVar1;
}

Assistant:

rtaudio_api_t rtaudio_compiled_api_by_name(const char *name) {
  RtAudio::Api api = RtAudio::UNSPECIFIED;
  if (name) {
    api = RtAudio::getCompiledApiByName(name);
  }
  return (rtaudio_api_t)api;
}